

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_greedy_dictMatchState_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *iEnd;
  undefined8 *puVar1;
  U32 UVar2;
  BYTE *pBVar3;
  U32 *pUVar4;
  seqDef *psVar5;
  undefined8 uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  size_t sVar11;
  byte bVar12;
  BYTE *pBVar13;
  int *mEnd;
  int *piVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  BYTE *pBVar18;
  int *ip;
  seqStore_t *psVar19;
  ulong uVar20;
  ZSTD_matchState_t *pZVar21;
  uint *puVar22;
  uint local_e8;
  uint local_e4;
  int local_e0;
  size_t offbaseFound;
  uint local_c4;
  ulong local_c0;
  uint local_b4;
  int *local_b0;
  uint local_a4;
  seqStore_t *local_a0;
  BYTE *local_98;
  ulong local_90;
  ZSTD_matchState_t *local_88;
  uint *local_80;
  BYTE *local_78;
  int *local_70;
  BYTE *local_68;
  ulong local_60;
  int *local_58;
  int local_4c;
  size_t local_48;
  BYTE *local_40;
  ulong local_38;
  
  pBVar3 = (ms->window).base;
  local_b4 = (ms->cParams).minMatch;
  if (5 < local_b4) {
    local_b4 = 6;
  }
  if (local_b4 < 5) {
    local_b4 = 4;
  }
  local_c4 = (ms->cParams).searchLog;
  uVar17 = 6;
  if (local_c4 < 6) {
    uVar17 = local_c4;
  }
  local_a4 = (ms->window).dictLimit;
  local_c0 = (ulong)local_a4;
  if (uVar17 < 5) {
    uVar17 = 4;
  }
  local_78 = pBVar3 + local_c0;
  pZVar21 = ms->dictMatchState;
  local_68 = (pZVar21->window).base;
  local_40 = local_68 + (pZVar21->window).dictLimit;
  local_70 = (int *)(pZVar21->window).nextSrc;
  uVar7 = ((int)src - ((int)local_40 + (int)local_78)) + (int)local_70;
  ip = (int *)((long)src + (ulong)(uVar7 == 0));
  local_e4 = *rep;
  local_a0 = seqStore;
  if (uVar7 < local_e4) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x603,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_e8 = rep[1];
  local_80 = rep;
  if (uVar7 < local_e8) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x604,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  iEnd = (int *)(srcSize + (long)src);
  local_58 = (int *)((long)src + (srcSize - 0x10));
  local_a4 = ((int)local_68 - (int)local_70) + local_a4;
  ms->lazySkipping = 0;
  uVar20 = (ulong)ms->nextToUpdate;
  UVar2 = ms->rowHashLog;
  uVar7 = ((int)local_58 - (int)(pBVar3 + uVar20)) + 1;
  if (7 < uVar7) {
    uVar7 = 8;
  }
  uVar9 = 0;
  if (pBVar3 + uVar20 <= local_58) {
    uVar9 = uVar7;
  }
  pUVar4 = ms->hashTable;
  local_60 = (ulong)(uVar9 + ms->nextToUpdate);
  local_90 = CONCAT44(local_90._4_4_,UVar2 + 8);
  local_b0 = (int *)(ulong)(0x38 - UVar2);
  local_98 = (BYTE *)CONCAT44(local_98._4_4_,0x18 - UVar2);
  bVar12 = (byte)uVar17;
  local_48 = 1L << (bVar12 & 0x3f);
  pBVar18 = ms->tagTable;
  local_88 = ms;
  for (; uVar20 < local_60; uVar20 = uVar20 + 1) {
    if (0x20 < (uint)local_90) {
LAB_001c8919:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x353,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    if (local_b4 == 5) {
      uVar16 = *(long *)(pBVar3 + uVar20) * -0x30e4432345000000;
LAB_001c817d:
      uVar16 = (uVar16 ^ local_88->hashSalt) >> ((byte)local_b0 & 0x3f);
    }
    else {
      if (local_b4 == 6) {
        uVar16 = *(long *)(pBVar3 + uVar20) * -0x30e4432340650000;
        goto LAB_001c817d;
      }
      uVar16 = (ulong)((*(int *)(pBVar3 + uVar20) * -0x61c8864f ^ (uint)local_88->hashSalt) >>
                      ((byte)local_98 & 0x1f));
    }
    uVar7 = ((uint)(uVar16 >> 8) & 0xffffff) << (bVar12 & 0x1f);
    if (((ulong)(pUVar4 + uVar7) & 0x3f) != 0) {
LAB_001c8938:
      __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                    ,0x32e,"void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)"
                   );
    }
    iVar8 = ZSTD_isAligned(pBVar18 + uVar7,local_48);
    if (iVar8 == 0) {
LAB_001c8957:
      __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                    ,0x32f,"void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)"
                   );
    }
    local_88->hashCache[(uint)uVar20 & 7] = (U32)uVar16;
  }
  local_98 = local_68 + -(ulong)local_a4;
  local_b0 = iEnd + -8;
  uVar7 = local_b4;
  puVar22 = local_80;
  pZVar21 = local_88;
LAB_001c8256:
  do {
    if (local_58 <= ip) {
      *puVar22 = local_e4;
      puVar22[1] = local_e8;
      return (long)iEnd - (long)src;
    }
    local_e0 = (int)pBVar3;
    uVar9 = (((int)ip - local_e0) - local_e4) + 1;
    uVar10 = (uint)local_c0;
    if (uVar9 - uVar10 < 0xfffffffd) {
      piVar14 = (int *)(pBVar3 + uVar9);
      if (uVar9 < uVar10) {
        piVar14 = (int *)(local_68 + (uVar9 - local_a4));
      }
      if (*piVar14 != *(int *)((long)ip + 1)) goto LAB_001c82a4;
      mEnd = iEnd;
      if (uVar9 < uVar10) {
        mEnd = local_70;
      }
      sVar11 = ZSTD_count_2segments
                         ((BYTE *)((long)ip + 5),(BYTE *)(piVar14 + 1),(BYTE *)iEnd,(BYTE *)mEnd,
                          local_78);
      uVar20 = sVar11 + 4;
      ip = (int *)((long)ip + 1);
      sVar11 = 1;
LAB_001c847c:
      psVar19 = local_a0;
      if (local_a0->maxNbSeq <=
          (ulong)((long)local_a0->sequences - (long)local_a0->sequencesStart >> 3)) {
LAB_001c8976:
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x29d,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0x20000 < local_a0->maxNbLit) {
LAB_001c89d3:
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x29f,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      uVar16 = (long)ip - (long)src;
      pBVar18 = local_a0->lit;
      if (local_a0->litStart + local_a0->maxNbLit < pBVar18 + uVar16) {
LAB_001c89f2:
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2a0,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (iEnd < ip) {
LAB_001c89b4:
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2a1,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (local_b0 < ip) {
        ZSTD_safecopyLiterals(pBVar18,(BYTE *)src,(BYTE *)ip,(BYTE *)local_b0);
LAB_001c84f0:
        psVar19->lit = psVar19->lit + uVar16;
        puVar22 = local_80;
        if (0xffff < uVar16) {
          if (psVar19->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2b2,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          psVar19->longLengthType = ZSTD_llt_literalLength;
          psVar19->longLengthPos =
               (U32)((ulong)((long)psVar19->sequences - (long)psVar19->sequencesStart) >> 3);
        }
      }
      else {
        uVar6 = *(undefined8 *)((long)src + 8);
        *(undefined8 *)pBVar18 = *src;
        *(undefined8 *)(pBVar18 + 8) = uVar6;
        pBVar18 = local_a0->lit;
        if (0x10 < uVar16) {
          if ((BYTE *)0xffffffffffffffe0 < pBVar18 + 0x10 + (-0x10 - ((long)src + 0x10))) {
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                          ,0xe9,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          uVar6 = *(undefined8 *)((long)src + 0x18);
          *(undefined8 *)(pBVar18 + 0x10) = *(undefined8 *)((long)src + 0x10);
          *(undefined8 *)(pBVar18 + 0x18) = uVar6;
          if (0x20 < (long)uVar16) {
            lVar15 = 0;
            do {
              puVar1 = (undefined8 *)((long)src + lVar15 + 0x20);
              uVar6 = puVar1[1];
              pBVar13 = pBVar18 + lVar15 + 0x20;
              *(undefined8 *)pBVar13 = *puVar1;
              *(undefined8 *)(pBVar13 + 8) = uVar6;
              puVar1 = (undefined8 *)((long)src + lVar15 + 0x30);
              uVar6 = puVar1[1];
              *(undefined8 *)(pBVar13 + 0x10) = *puVar1;
              *(undefined8 *)(pBVar13 + 0x18) = uVar6;
              lVar15 = lVar15 + 0x20;
            } while (pBVar13 + 0x20 < pBVar18 + uVar16);
          }
          goto LAB_001c84f0;
        }
        local_a0->lit = pBVar18 + uVar16;
      }
      psVar5 = psVar19->sequences;
      psVar5->litLength = (U16)uVar16;
      psVar5->offBase = (U32)sVar11;
      if (uVar20 < 3) {
LAB_001c8995:
        __assert_fail("matchLength >= MINMATCH",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,700,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0xffff < uVar20 - 3) {
        if (psVar19->longLengthType != ZSTD_llt_none) {
LAB_001c8a11:
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2bf,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        psVar19->longLengthType = ZSTD_llt_matchLength;
        psVar19->longLengthPos = (U32)((ulong)((long)psVar5 - (long)psVar19->sequencesStart) >> 3);
      }
      psVar5->mlBase = (U16)(uVar20 - 3);
      psVar19->sequences = psVar5 + 1;
      if (pZVar21->lazySkipping != 0) {
        uVar7 = pZVar21->nextToUpdate;
        uVar16 = (ulong)uVar7;
        UVar2 = pZVar21->rowHashLog;
        uVar9 = ((int)local_58 - (int)(pBVar3 + uVar16)) + 1;
        if (7 < uVar9) {
          uVar9 = 8;
        }
        if (local_58 < pBVar3 + uVar16) {
          uVar9 = 0;
        }
        pUVar4 = pZVar21->hashTable;
        pBVar18 = pZVar21->tagTable;
        local_60 = CONCAT44(local_60._4_4_,UVar2 + 8);
        local_90 = (ulong)(0x38 - UVar2);
        local_4c = 0x18 - UVar2;
        local_38 = uVar20;
        for (; uVar16 < uVar9 + uVar7; uVar16 = uVar16 + 1) {
          if (0x20 < (uint)local_60) goto LAB_001c8919;
          if (local_b4 == 5) {
            uVar20 = *(long *)(pBVar3 + uVar16) * -0x30e4432345000000;
LAB_001c86e7:
            uVar20 = (uVar20 ^ pZVar21->hashSalt) >> ((byte)local_90 & 0x3f);
          }
          else {
            if (local_b4 == 6) {
              uVar20 = *(long *)(pBVar3 + uVar16) * -0x30e4432340650000;
              goto LAB_001c86e7;
            }
            uVar20 = (ulong)((*(int *)(pBVar3 + uVar16) * -0x61c8864f ^ (uint)pZVar21->hashSalt) >>
                            ((byte)local_4c & 0x1f));
          }
          uVar10 = ((uint)(uVar20 >> 8) & 0xffffff) << (bVar12 & 0x1f);
          if (((ulong)(pUVar4 + uVar10) & 0x3f) != 0) goto LAB_001c8938;
          iVar8 = ZSTD_isAligned(pBVar18 + uVar10,local_48);
          if (iVar8 == 0) goto LAB_001c8957;
          local_88->hashCache[(uint)uVar16 & 7] = (U32)uVar20;
          pZVar21 = local_88;
        }
        pZVar21->lazySkipping = 0;
        uVar20 = local_38;
        psVar19 = local_a0;
        puVar22 = local_80;
      }
      uVar7 = local_e8;
      for (ip = (int *)((long)ip + uVar20); local_e8 = uVar7, uVar7 = local_b4, src = ip,
          ip <= local_58; ip = (int *)((long)ip + sVar11 + 4)) {
        uVar9 = ((int)ip - local_e0) - local_e8;
        uVar10 = (uint)local_c0;
        pBVar18 = pBVar3;
        if (uVar9 < uVar10) {
          pBVar18 = local_98;
        }
        if ((0xfffffffc < uVar9 - uVar10) || (*(int *)(pBVar18 + uVar9) != *ip)) break;
        piVar14 = iEnd;
        if (uVar9 < uVar10) {
          piVar14 = local_70;
        }
        sVar11 = ZSTD_count_2segments
                           ((BYTE *)(ip + 1),(BYTE *)((long)(pBVar18 + uVar9) + 4),(BYTE *)iEnd,
                            (BYTE *)piVar14,local_78);
        if (psVar19->maxNbSeq <=
            (ulong)((long)psVar19->sequences - (long)psVar19->sequencesStart >> 3))
        goto LAB_001c8976;
        if (0x20000 < psVar19->maxNbLit) goto LAB_001c89d3;
        pBVar18 = psVar19->lit;
        if (psVar19->litStart + psVar19->maxNbLit < pBVar18) goto LAB_001c89f2;
        if (iEnd < ip) goto LAB_001c89b4;
        if (local_b0 < ip) {
          ZSTD_safecopyLiterals(pBVar18,(BYTE *)ip,(BYTE *)ip,(BYTE *)local_b0);
        }
        else {
          uVar6 = *(undefined8 *)(ip + 2);
          *(undefined8 *)pBVar18 = *(undefined8 *)ip;
          *(undefined8 *)(pBVar18 + 8) = uVar6;
        }
        psVar5 = psVar19->sequences;
        psVar5->litLength = 0;
        psVar5->offBase = 1;
        if (sVar11 + 4 < 3) goto LAB_001c8995;
        if (0xffff < sVar11 + 1) {
          if (psVar19->longLengthType != ZSTD_llt_none) goto LAB_001c8a11;
          psVar19->longLengthType = ZSTD_llt_matchLength;
          psVar19->longLengthPos = (U32)((ulong)((long)psVar5 - (long)psVar19->sequencesStart) >> 3)
          ;
        }
        psVar5->mlBase = (U16)(sVar11 + 1);
        psVar19->sequences = psVar5 + 1;
        uVar7 = local_e4;
        local_e4 = local_e8;
      }
      goto LAB_001c8256;
    }
LAB_001c82a4:
    offbaseFound = 999999999;
    if (uVar7 == 6) {
      if (uVar17 == 6) {
        uVar20 = ZSTD_RowFindBestMatch_dictMatchState_6_6
                           (pZVar21,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
      }
      else if (uVar17 == 5) {
        uVar20 = ZSTD_RowFindBestMatch_dictMatchState_6_5
                           (pZVar21,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
      }
      else {
        uVar20 = ZSTD_RowFindBestMatch_dictMatchState_6_4
                           (pZVar21,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
      }
    }
    else if (uVar7 == 5) {
      if (uVar17 == 6) {
        uVar20 = ZSTD_RowFindBestMatch_dictMatchState_5_6
                           (pZVar21,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
      }
      else if (uVar17 == 5) {
        uVar20 = ZSTD_RowFindBestMatch_dictMatchState_5_5
                           (pZVar21,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
      }
      else {
        uVar20 = ZSTD_RowFindBestMatch_dictMatchState_5_4
                           (pZVar21,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
      }
    }
    else if (uVar17 == 6) {
      uVar20 = ZSTD_RowFindBestMatch_dictMatchState_4_6
                         (pZVar21,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
    }
    else if (uVar17 == 5) {
      uVar20 = ZSTD_RowFindBestMatch_dictMatchState_4_5
                         (pZVar21,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
    }
    else {
      uVar20 = ZSTD_RowFindBestMatch_dictMatchState_4_4
                         (pZVar21,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
    }
    if (3 < uVar20) {
      sVar11 = offbaseFound;
      if (3 < offbaseFound) {
        uVar16 = (long)ip + (-(long)pBVar3 - offbaseFound) + -0xfffffffd;
        pBVar13 = pBVar3;
        pBVar18 = local_78;
        if ((uint)uVar16 < (uint)local_c0) {
          pBVar13 = local_98;
          pBVar18 = local_40;
        }
        pBVar13 = pBVar13 + (uVar16 & 0xffffffff);
        for (; ((src < ip && (pBVar18 < pBVar13)) && (*(BYTE *)((long)ip + -1) == pBVar13[-1]));
            ip = (int *)((long)ip + -1)) {
          pBVar13 = pBVar13 + -1;
          uVar20 = uVar20 + 1;
        }
        local_e8 = local_e4;
        local_e4 = (int)offbaseFound - 3;
      }
      goto LAB_001c847c;
    }
    uVar20 = (long)ip - (long)src;
    ip = (int *)((long)ip + (uVar20 >> 8) + 1);
    pZVar21->lazySkipping = (uint)(0x7ff < uVar20);
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_greedy_dictMatchState_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 0, ZSTD_dictMatchState);
}